

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O2

void summaryindex::indexevents
               (string *fullfilename,vector<int,_std::allocator<int>_> *event_ids,
               map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *summary_id_file_id_to_offset,int file_id)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  mapped_type *this;
  long lVar3;
  int iVar4;
  longlong offset;
  int local_64;
  summary_keyz k;
  int summarycalcstream_type;
  summarySampleslevelHeader sh;
  undefined4 local_38;
  int samplesize;
  
  local_64 = file_id;
  __stream = fopen((fullfilename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: cannot open %s\n",(fullfilename->_M_dataplus)._M_p);
    iVar4 = 1;
LAB_001025bf:
    exit(iVar4);
  }
  offset = 0;
  summarycalcstream_type = 0;
  lVar3 = 4;
  sVar2 = fread(&summarycalcstream_type,4,1,__stream);
  if (sVar2 != 0) {
    offset = 4;
    lVar3 = 8;
  }
  if ((summarycalcstream_type & 0x3000000U) != 0x3000000) {
    fprintf(_stderr,"FATAL: Not a summarycalc stream type %d\n");
    iVar4 = -1;
    goto LAB_001025bf;
  }
  sVar2 = fread(&samplesize,4,1,__stream);
  if (sVar2 != 0) {
    local_38 = 0;
    offset = lVar3;
    sVar2 = fread(&local_38,4,1,__stream);
    if (sVar2 != 0) {
      offset = lVar3 + 4;
      goto LAB_001024c6;
    }
  }
  sVar2 = 0;
LAB_001024c6:
  iVar4 = -1;
  do {
    if ((sVar2 == 0) || (sVar2 = fread(&sh,0xc,1,__stream), sVar2 == 0)) {
      fclose(__stream);
      return;
    }
    k.summary_id = sh.summary_id;
    k.fileindex = local_64;
    this = std::
           map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
           ::operator[](summary_id_file_id_to_offset,&k);
    std::vector<long_long,_std::allocator<long_long>_>::push_back(this,&offset);
    iVar1 = sh.event_id;
    if (sh.event_id != iVar4) {
      std::vector<int,_std::allocator<int>_>::push_back(event_ids,&sh.event_id);
      iVar4 = iVar1;
    }
    offset = offset + 0xc;
    do {
      sVar2 = fread(&k,8,1,__stream);
      if (sVar2 == 0) break;
      offset = offset + 8;
    } while (k.summary_id != 0);
  } while( true );
}

Assistant:

void indexevents(const std::string& fullfilename, std::vector<int> &event_ids, std::map<summary_keyz, std::vector<long long>> &summary_id_file_id_to_offset, int file_id) {
	FILE* fin = fopen(fullfilename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n",  fullfilename.c_str());
		exit(EXIT_FAILURE);
	}
	long long offset = 0;
	int summarycalcstream_type = 0;
	size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
	if (i != 0) offset += sizeof(summarycalcstream_type);
	int stream_type = summarycalcstream_type & summarycalc_id;

	if (stream_type != summarycalc_id) {
		fprintf(stderr, "FATAL: Not a summarycalc stream type %d\n",  stream_type);
		exit(-1);
	}

	stream_type = streamno_mask & summarycalcstream_type;
	int samplesize;
	i = fread(&samplesize, sizeof(samplesize), 1, fin);
	if (i != 0) offset += sizeof(samplesize);
	int summary_set = 0;
	if (i != 0) i = fread(&summary_set, sizeof(summary_set), 1, fin);
	if (i != 0) offset += sizeof(summary_set);
	summarySampleslevelHeader sh;
	int last_event_id = -1;
	while (i != 0) {
		i = fread(&sh, sizeof(sh), 1, fin);
		if (i != 0) {
			summary_keyz k;
			k.summary_id = sh.summary_id;
			k.fileindex = file_id;
			summary_id_file_id_to_offset[k].push_back(offset);
			if (sh.event_id != last_event_id) {
				last_event_id = sh.event_id;
				event_ids.push_back(sh.event_id);
			}
			// fprintf(stdout, "%d, %d, %lld\n", sh.summary_id,sh.event_id, offset);
			offset += sizeof(sh);
		}
		while (i != 0) {
			sampleslevelRec sr;
			i = fread(&sr, sizeof(sr), 1, fin);
			if (i != 0) offset += sizeof(sr);
			if (i == 0) break;
			if (sr.sidx == 0) break;
		}
	}

	fclose(fin);
}